

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_initialize(void)

{
  int iVar1;
  int *piVar2;
  Integer *pIVar3;
  Integer IVar4;
  void **ptr_arr;
  long n;
  void *__ptr;
  Integer IVar5;
  MPI_Comm poVar6;
  Integer myproc;
  Integer *nodelist;
  Integer numnodes;
  MPI_Comm comm;
  int bytes;
  Integer zero;
  Integer nnode;
  Integer nproc;
  Integer j;
  Integer i;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  char ***in_stack_000001a8;
  int *in_stack_000001b0;
  char ***in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  Integer in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  Integer in_stack_ffffffffffffffb8;
  Integer in_stack_ffffffffffffffc0;
  Integer *count;
  Integer *list;
  long local_8;
  
  if (GAinitialized == 0) {
    if (ARMCIinitialized == 0) {
      if (GA_memory_limited != 0) {
        ARMCI_Set_shm_limit(GA_total_memory);
      }
      if (_ga_initialize_c == 0) {
        if (_ga_initialize_f == 0) {
          pnga_error(in_stack_00000140,in_stack_00000138);
        }
        else {
          _ga_argc = (int *)malloc(4);
          _ga_argv = (char ***)malloc(8);
          if (_ga_argc == (int *)0x0) {
            pnga_error(in_stack_00000140,in_stack_00000138);
          }
          ga_f2c_get_cmd_args(in_stack_000001b0,in_stack_000001a8);
          ARMCI_Init_args(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
      else if (_ga_initialize_args == 0) {
        ARMCI_Init();
      }
      else {
        ARMCI_Init_args(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      ARMCIinitialized = 1;
    }
    GA_Default_Proc_Group = -1;
    _ga_main_data_structure = (global_array_t *)malloc(0x1b40000);
    _proc_list_main_data_structure = (proc_list_t *)malloc(0x140000);
    if (_ga_main_data_structure == (global_array_t *)0x0) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    if (_proc_list_main_data_structure == (proc_list_t *)0x0) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    GA = _ga_main_data_structure;
    PGRP_LIST = _proc_list_main_data_structure;
    for (local_8 = 0; local_8 < 0x8000; local_8 = local_8 + 1) {
      GA[local_8].ptr = (char **)0x0;
      GA[local_8].mapc = (C_Integer *)0x0;
      GA[local_8].rstrctd_list = (C_Integer *)0x0;
      GA[local_8].rank_rstrctd = (C_Integer *)0x0;
      GA[local_8].property = 0;
      GA[local_8].mem_dev_set = 0;
      GA[local_8].actv = 0;
      GA[local_8].p_handle = GA_Init_Proc_Group;
      GA[local_8].overlay = 0;
      PGRP_LIST[local_8].map_proc_list = (int *)0x0;
      PGRP_LIST[local_8].inv_map_proc_list = (int *)0x0;
      PGRP_LIST[local_8].actv = 0;
    }
    memset(&GAstat,0,0x80);
    gai_nb_init();
    iVar1 = armci_msg_nproc();
    GAnproc = (Integer)iVar1;
    mapALL = (Integer *)malloc((GAnproc + 6) * 8);
    iVar1 = armci_msg_me();
    GAme = (Integer)iVar1;
    if ((GAme < 0) || (GAnproc < GAme)) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    iVar1 = armci_msg_me();
    MPme = (Integer)iVar1;
    gai_init_onesided();
    for (local_8 = 0; local_8 < _max_global_array; local_8 = local_8 + 1) {
      GA[local_8].actv = 0;
    }
    for (local_8 = 0; local_8 < _max_global_array; local_8 = local_8 + 1) {
      GA[local_8].actv_handle = 0;
    }
    piVar2 = (int *)malloc(GAnproc << 3);
    PGRP_LIST->map_proc_list = piVar2;
    PGRP_LIST->inv_map_proc_list = PGRP_LIST->map_proc_list + GAnproc;
    for (local_8 = 0; local_8 < GAnproc; local_8 = local_8 + 1) {
      PGRP_LIST->map_proc_list[local_8] = -1;
    }
    for (local_8 = 0; local_8 < GAnproc; local_8 = local_8 + 1) {
      PGRP_LIST->inv_map_proc_list[local_8] = -1;
    }
    pnga_cluster_nodeid();
    pIVar3 = (Integer *)pnga_cluster_nprocs(0x1d581f);
    IVar4 = pnga_cluster_procid((Integer)in_stack_ffffffffffffffa0,
                                (Integer)in_stack_ffffffffffffff98);
    PGRP_LIST->parent = -1;
    PGRP_LIST->actv = 1;
    PGRP_LIST->map_nproc = (int)pIVar3;
    PGRP_LIST->mirrored = 1;
    for (local_8 = 0; local_8 < (long)pIVar3; local_8 = local_8 + 1) {
      PGRP_LIST->map_proc_list[local_8 + IVar4] = (int)local_8;
      PGRP_LIST->inv_map_proc_list[local_8] = (int)local_8 + (int)IVar4;
    }
    ptr_arr = (void **)(long)GA_World_Proc_Group;
    count = pIVar3;
    pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffa8,(char *)ptr_arr);
    n = (long)GA_World_Proc_Group;
    list = count;
    pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,n,
                    (char *)ptr_arr);
    if (pIVar3 == list) {
      IVar4 = pnga_cluster_nnodes();
      __ptr = malloc(IVar4 << 3);
      in_stack_ffffffffffffff98 = (char ***)GAme;
      IVar5 = pnga_cluster_procid((Integer)ptr_arr,GAme);
      for (local_8 = 0; local_8 < IVar4; local_8 = local_8 + 1) {
        *(long *)((long)__ptr + local_8 * 8) =
             (long)in_stack_ffffffffffffff98 + (local_8 * (long)count - IVar5);
      }
      _mirror_gop_grp = pnga_pgroup_create(list,(Integer)count);
      free(__ptr);
    }
    else {
      _mirror_gop_grp = (Integer)GA_World_Proc_Group;
    }
    GA_Update_Flags = (int **)malloc(GAnproc << 3);
    if (GA_Update_Flags == (int **)0x0) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    iVar1 = ARMCI_Malloc(ptr_arr,(armci_size_t)in_stack_ffffffffffffff98);
    if (iVar1 != 0) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    if (GA_Update_Flags[GAme] == (int *)0x0) {
      pnga_error(in_stack_00000140,in_stack_00000138);
    }
    GA_Update_Signal = (int *)ARMCI_Malloc_local(0x1d5b03);
    for (local_8 = 0; local_8 < 0xe; local_8 = local_8 + 1) {
      GA_Update_Flags[GAme][local_8] = 0;
    }
    MA_set_error_callback(ARMCI_Error);
    GAinitialized = 1;
    poVar6 = GA_MPI_Comm_pgroup(0);
    MPI_Comm_dup(poVar6,&GA_MPI_World_comm_dup);
    sai_init_sparse_arrays();
  }
  return;
}

Assistant:

void pnga_initialize()
{
    Integer  i, j,nproc, nnode, zero;
    int bytes;
    GA_Internal_Threadsafe_Lock();
#ifdef MSG_COMMS_MPI
        MPI_Comm comm;
#endif

    if(GAinitialized)
    {
        GA_Internal_Threadsafe_Unlock();
        return;
    }

#if HAVE_ARMCI_INITIALIZED_FUNCTION
    if (!ARMCI_Initialized())
#else
    if (!ARMCIinitialized)
#endif
    {
        /* assure that GA will not alocate more shared memory than specified */
        if(GA_memory_limited) ARMCI_Set_shm_limit(GA_total_memory);
        if (_ga_initialize_c) {
            if (_ga_initialize_args) {
                ARMCI_Init_args(_ga_argc, _ga_argv);
            }
            else {
                ARMCI_Init();
            }
        }
        else if (_ga_initialize_f) {
            _ga_argc = malloc(sizeof(int));
            _ga_argv = malloc(sizeof(char**));
            if (!_ga_argc) pnga_error("malloc argc failed",1);
            ga_f2c_get_cmd_args(_ga_argc, _ga_argv);
            ARMCI_Init_args(_ga_argc, _ga_argv);
        }
        else {
            pnga_error("pnga_initialize called outside of C or F APIs",1);
        }
        ARMCIinitialized = 1;
    }
    
    GA_Default_Proc_Group = -1;
    /* zero in pointers in GA array */
    _ga_main_data_structure
       = (global_array_t *)malloc(sizeof(global_array_t)*MAX_ARRAYS);
    _proc_list_main_data_structure
       = (proc_list_t *)malloc(sizeof(proc_list_t)*MAX_ARRAYS);
    if(!_ga_main_data_structure)
       pnga_error("ga_init:malloc ga failed",0);
    if(!_proc_list_main_data_structure)
       pnga_error("ga_init:malloc proc_list failed",0);
    GA = _ga_main_data_structure;
    PGRP_LIST = _proc_list_main_data_structure;
    for(i=0;i<MAX_ARRAYS; i++) {
       GA[i].ptr  = (char**)0;
       GA[i].mapc = (C_Integer*)0;
       GA[i].rstrctd_list = (C_Integer*)0;
       GA[i].rank_rstrctd = (C_Integer*)0;
       GA[i].property = NO_PROPERTY;
       GA[i].mem_dev_set = 0;
#ifdef ENABLE_CHECKPOINT
       GA[i].record_id = 0;
#endif
       GA[i].actv = 0;
       GA[i].p_handle = GA_Init_Proc_Group;
       GA[i].overlay = 0;
       PGRP_LIST[i].map_proc_list = (int*)0;
       PGRP_LIST[i].inv_map_proc_list = (int*)0;
       PGRP_LIST[i].actv = 0;
    }

    bzero(&GAstat,sizeof(GAstat));

    /* initialize some data structures used in non-blocking communication */
    gai_nb_init();

    GAnproc = (Integer)armci_msg_nproc();

    /* Allocate arrays used by library */
    mapALL = (Integer*)malloc((GAnproc+MAXDIM-1)*sizeof(Integer*));

    GAme = (Integer)armci_msg_me();
    if(GAme<0 || GAme>GAnproc) 
       pnga_error("ga_init:message-passing initialization problem: my ID=",GAme);

    MPme= (Integer)armci_msg_me();

    gai_init_onesided();

    /* set activity status for all arrays to inactive */
    for(i=0;i<_max_global_array;i++)GA[i].actv=0;
    for(i=0;i<_max_global_array;i++)GA[i].actv_handle=0;

    /* Create proc list for mirrored arrays */
    PGRP_LIST[0].map_proc_list = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[0].inv_map_proc_list = PGRP_LIST[0].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++) PGRP_LIST[0].inv_map_proc_list[i] = -1;
    nnode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(nnode);
    zero = 0;
    j = pnga_cluster_procid(nnode, zero);
    PGRP_LIST[0].parent = -1;
    PGRP_LIST[0].actv = 1;
    PGRP_LIST[0].map_nproc = nproc;
    PGRP_LIST[0].mirrored = 1;
    for (i=0; i<nproc; i++) {
       PGRP_LIST[0].map_proc_list[i+j] = i;
       PGRP_LIST[0].inv_map_proc_list[i] = i+j;
    }

    /* Set up group for doing cluster merge. Start by checking if
     * number of procs per node is the same for all nodes */
    i = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&i,1,"max");
    j = nproc;
    pnga_pgroup_gop(GA_World_Proc_Group,pnga_type_f2c(MT_F_INT),&j,1,"min");
    if (i == j) {
      /* construct a group that containing all processors with the same local
       * proc ID across all nodes in the system */
      Integer numnodes = pnga_cluster_nnodes();
      Integer *nodelist = (Integer*)malloc(numnodes*sizeof(Integer));
      Integer myproc = GAme-pnga_cluster_procid(nnode,zero);
      for (i=0; i<numnodes; i++) {
        nodelist[i] = i*nproc+myproc;
      }
      _mirror_gop_grp = pnga_pgroup_create(nodelist,numnodes);
      free(nodelist);
    } else {
      _mirror_gop_grp = GA_World_Proc_Group;
    }



    /* Allocate memory for update flags and signal*/
    bytes = 2*MAXDIM*sizeof(int);
    GA_Update_Flags = (int**)malloc(GAnproc*sizeof(void*));
    if (!GA_Update_Flags)
      pnga_error("ga_init: Failed to initialize GA_Update_Flags",(int)GAme);
    if (ARMCI_Malloc((void**)GA_Update_Flags, (armci_size_t) bytes))
      pnga_error("ga_init:Failed to initialize memory for update flags",GAme);
    if(GA_Update_Flags[GAme]==NULL)pnga_error("ga_init:ARMCIMalloc failed",GAme);

    bytes = sizeof(int);
    GA_Update_Signal = ARMCI_Malloc_local((armci_size_t) bytes);

    /* Zero update flags */
    for (i=0; i<2*MAXDIM; i++) {
		GA_Update_Flags[GAme][i] = 0;
	}

    /* set MA error function */
    MA_set_error_callback(ARMCI_Error);

    GAinitialized = 1;

#ifdef PROFILE_OLD 
    ga_profile_init();
#endif
#ifdef ENABLE_CHECKPOINT
    {
    Integer tmplist[1000];
    Integer tmpcount;
    tmpcount = GAnproc-ga_spare_procs;
    for(i=0;i<tmpcount;i++)
            tmplist[i]=i;
    ga_group_is_for_ft=1;
    GA_Default_Proc_Group = pnga_pgroup_create(tmplist,tmpcount);
    ga_group_is_for_ft=0;
    if(GAme>=tmpcount)
      ga_irecover(0);
    printf("\n%d:here done with initialize\n",GAme);
                 
    }
#endif
    /* create duplicate of world communicator */
#ifdef MSG_COMMS_MPI
    comm =  GA_MPI_Comm_pgroup(-1);
    MPI_Comm_dup(comm, &GA_MPI_World_comm_dup);
#endif
    sai_init_sparse_arrays();
    GA_Internal_Threadsafe_Unlock();
}